

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

void __thiscall re2c::OutputFile::~OutputFile(OutputFile *this)

{
  FILE *__stream;
  OutputBlock *this_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  pointer ppOVar4;
  
  __stream = (FILE *)this->file;
  if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
    fclose(__stream);
  }
  ppOVar4 = (this->blocks).
            super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->blocks).super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar4) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      this_00 = ppOVar4[uVar2];
      if (this_00 != (OutputBlock *)0x0) {
        OutputBlock::~OutputBlock(this_00);
      }
      operator_delete(this_00,0x48);
      ppOVar4 = (this->blocks).
                super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar3 < (ulong)((long)(this->blocks).
                                    super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar4 >> 3)
      ;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  if (ppOVar4 != (pointer)0x0) {
    operator_delete(ppOVar4,(long)(this->blocks).
                                  super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar4
                   );
    return;
  }
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
	if (file != NULL && file != stdout)
	{
		fclose (file);
	}
	for (unsigned int i = 0; i < blocks.size (); ++i)
	{
		delete blocks[i];
	}
}